

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_string.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Keyword_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,Static_String *t_s)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  uVar1 = t_s->m_size;
  pcVar2 = (this->m_position).m_pos;
  pcVar3 = (this->m_position).m_end;
  if ((ulong)((long)pcVar3 - (long)pcVar2) < uVar1) {
    return false;
  }
  iVar6 = (this->m_position).line;
  iVar7 = (this->m_position).col;
  iVar5 = (this->m_position).m_last_col;
  uVar4 = 0;
  while( true ) {
    if (uVar1 == uVar4) {
      (this->m_position).line = iVar6;
      (this->m_position).col = iVar7;
      (this->m_position).m_pos = pcVar2 + uVar1;
      (this->m_position).m_last_col = iVar5;
      return true;
    }
    if (pcVar2[uVar4] != t_s->data[uVar4]) break;
    bVar8 = pcVar2[uVar4] == '\n';
    if (bVar8) {
      iVar5 = iVar7;
    }
    iVar7 = iVar7 + 1;
    if (bVar8) {
      iVar7 = 1;
    }
    iVar6 = iVar6 + (uint)bVar8;
    uVar4 = uVar4 + 1;
  }
  return uVar1 <= uVar4 || pcVar2 + uVar4 == pcVar3;
}

Assistant:

constexpr size_t size() const noexcept { return m_size; }